

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tensor_test.cc
# Opt level: O2

void __thiscall
anon_unknown.dwarf_776f::TENSOR_INDEXING_Test::~TENSOR_INDEXING_Test(TENSOR_INDEXING_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this);
  return;
}

Assistant:

TEST(TENSOR, INDEXING) {
        tensor<int, 3> ts(0, {3,4,5});
        EXPECT_EQ((ts[{1,2,3}]), 0);
        EXPECT_EQ((ts[{2,3,4}]), 0);
        ts[{1,2,3}] = 1;
        ts[{2,3,4}] = 2;
        EXPECT_EQ((ts[{1,2,3}]), 1);
        EXPECT_EQ((ts[{2,3,4}]), 2);
    }